

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall
FailableMemoryAllocator::failNthAllocAt
          (FailableMemoryAllocator *this,int allocationNumber,char *file,size_t line)

{
  int iVar1;
  undefined4 extraout_var;
  LocationToFailAllocNode *newNode;
  size_t line_local;
  char *file_local;
  int allocationNumber_local;
  FailableMemoryAllocator *this_local;
  
  iVar1 = (*(this->super_TestMemoryAllocator)._vptr_TestMemoryAllocator[8])(this,0x20);
  LocationToFailAllocNode::failNthAllocAt
            ((LocationToFailAllocNode *)CONCAT44(extraout_var,iVar1),allocationNumber,file,line,
             this->head_);
  this->head_ = (LocationToFailAllocNode *)CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

void FailableMemoryAllocator::failNthAllocAt(int allocationNumber, const char* file, size_t line)
{
    LocationToFailAllocNode* newNode = (LocationToFailAllocNode*) (void*) allocMemoryLeakNode(sizeof(LocationToFailAllocNode));
    newNode->failNthAllocAt(allocationNumber, file, line, head_);
    head_ = newNode;
}